

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall tinyusdz::crate::CrateReader::ReadFieldSets(CrateReader *this)

{
  long lVar1;
  pointer pSVar2;
  StreamReader *this_00;
  pointer pIVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  ostream *poVar6;
  ulong uVar7;
  size_t __new_size;
  size_t sVar8;
  pointer pcVar9;
  ulong uVar10;
  size_t sVar11;
  int iVar12;
  size_t i;
  char *pcVar13;
  pointer pcVar14;
  unsigned_long *in_R8;
  uint64_t num_fieldsets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmp;
  vector<char,_std::allocator<char>_> comp_buffer;
  uint64_t fsets_size;
  vector<char,_std::allocator<char>_> working_space;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8 [11];
  string local_50;
  
  lVar1 = this->_fieldsets_index;
  if ((lVar1 < 0) ||
     (pSVar2 = (this->_toc).sections.
               super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (long)(this->_toc).sections.
           super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>.
           _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 5 <= lVar1)) {
LAB_00186a00:
    ::std::__cxx11::string::append((char *)&this->_err);
    return false;
  }
  if ((this->_version[0] == '\0') && (this->_version[1] < 4)) {
    ::std::__cxx11::to_string(&local_228,0);
    ::std::operator+(&local_288,"Version must be 0.4.0 or later, but got ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_228
                    );
    ::std::operator+(&local_208,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_288
                     ,".");
    ::std::__cxx11::to_string(&local_1e8,(uint)this->_version[1]);
    ::std::operator+(&local_268,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_1e8);
    ::std::operator+(&local_248,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_268
                     ,".");
    ::std::__cxx11::to_string(&local_50,(uint)this->_version[2]);
    ::std::operator+(&bStack_2a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_248
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50
                    );
    ::std::operator+(local_1c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &bStack_2a8,"\n");
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    return false;
  }
  this_00 = this->_sr;
  uVar7 = pSVar2[lVar1].start;
  if (this_00->length_ < uVar7) goto LAB_00186a00;
  this_00->idx_ = uVar7;
  bVar5 = StreamReader::read8(this_00,(uint64_t *)&local_288);
  if (!bVar5) goto LAB_00186a00;
  if (local_288._M_dataplus._M_p == (pointer)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    poVar6 = ::std::operator<<((ostream *)local_1c8,"[error]");
    poVar6 = ::std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar6 = ::std::operator<<(poVar6,":");
    poVar6 = ::std::operator<<(poVar6,"ReadFieldSets");
    poVar6 = ::std::operator<<(poVar6,"():");
    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x16b9);
    ::std::operator<<(poVar6," ");
    pcVar13 = "`FIELDSETS` is empty.";
  }
  else {
    if ((pointer)(this->_config).maxNumFieldSets < local_288._M_dataplus._M_p) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      poVar6 = ::std::operator<<((ostream *)local_1c8,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,"[Crate]");
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"ReadFieldSets");
      poVar6 = ::std::operator<<(poVar6,"():");
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x16be);
      ::std::operator<<(poVar6," ");
      ::std::__cxx11::string::string
                ((string *)&local_248,"Too many FieldSets {}. maxNumFieldSets is set to {}",
                 (allocator *)&local_268);
      fmt::format<unsigned_long,unsigned_long>
                ((string *)&bStack_2a8,(fmt *)&local_248,(string *)&local_288,
                 &(this->_config).maxNumFieldSets,in_R8);
      poVar6 = ::std::operator<<((ostream *)local_1c8,(string *)&bStack_2a8);
      ::std::operator<<(poVar6,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      goto LAB_00186d6a;
    }
    uVar7 = (long)local_288._M_dataplus._M_p * 4 + this->_memoryUsage;
    this->_memoryUsage = uVar7;
    if ((this->_config).maxMemoryBudget < uVar7) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      poVar6 = ::std::operator<<((ostream *)local_1c8,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,"[Crate]");
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"ReadFieldSets");
      poVar6 = ::std::operator<<(poVar6,"():");
      iVar12 = 0x16c1;
    }
    else {
      ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::resize
                (&this->_fieldset_indices,(size_type)local_288._M_dataplus._M_p);
      __new_size = Usd_IntegerCompression::GetCompressedBufferSize
                             ((size_t)local_288._M_dataplus._M_p);
      uVar7 = this->_memoryUsage + __new_size;
      this->_memoryUsage = uVar7;
      if (uVar7 <= (this->_config).maxMemoryBudget) {
        local_248._M_dataplus._M_p = (char *)0x0;
        local_248._M_string_length = 0;
        local_248.field_2._M_allocated_capacity = 0;
        ::std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)&local_248,__new_size);
        uVar7 = (long)local_288._M_dataplus._M_p * 4 + this->_memoryUsage;
        this->_memoryUsage = uVar7;
        if ((this->_config).maxMemoryBudget < uVar7) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
          poVar6 = ::std::operator<<((ostream *)local_1c8,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,"[Crate]");
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReadFieldSets");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x16ce);
          ::std::operator<<(poVar6," ");
          poVar6 = ::std::operator<<((ostream *)local_1c8,"Reached to max memory budget.");
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::append((string *)&this->_err);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
          bVar5 = false;
          goto LAB_001871d5;
        }
        local_268._M_dataplus._M_p = (pointer)0x0;
        local_268._M_string_length = 0;
        local_268.field_2._M_allocated_capacity = 0;
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_268,
                   (size_type)local_288._M_dataplus._M_p);
        sVar8 = Usd_IntegerCompression::GetDecompressionWorkingSpaceSize
                          ((size_t)local_288._M_dataplus._M_p);
        uVar7 = this->_memoryUsage + sVar8;
        this->_memoryUsage = uVar7;
        if ((this->_config).maxMemoryBudget < uVar7) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
          poVar6 = ::std::operator<<((ostream *)local_1c8,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,"[Crate]");
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReadFieldSets");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x16d5);
          ::std::operator<<(poVar6," ");
          poVar6 = ::std::operator<<((ostream *)local_1c8,"Reached to max memory budget.");
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::append((string *)&this->_err);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
          bVar5 = false;
        }
        else {
          local_208._M_dataplus._M_p = (char *)0x0;
          local_208._M_string_length = 0;
          local_208.field_2._M_allocated_capacity = 0;
          ::std::vector<char,_std::allocator<char>_>::resize
                    ((vector<char,_std::allocator<char>_> *)&local_208,sVar8);
          bVar5 = StreamReader::read8(this->_sr,(uint64_t *)&local_228);
          if (bVar5) {
            if (local_248._M_string_length - local_248._M_dataplus._M_p < local_228._M_dataplus._M_p
               ) {
              local_228._M_dataplus._M_p = local_248._M_string_length - local_248._M_dataplus._M_p;
            }
            _Var4._M_p = local_228._M_dataplus._M_p;
            if ((pointer)this->_sr->length_ < local_228._M_dataplus._M_p) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
              poVar6 = ::std::operator<<((ostream *)local_1c8,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,"[Crate]");
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"ReadFieldSets");
              poVar6 = ::std::operator<<(poVar6,"():");
              poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x16e7);
              ::std::operator<<(poVar6," ");
              pcVar13 = "FieldSets compressed data exceeds USDC data.";
              goto LAB_00187170;
            }
            pcVar9 = (pointer)StreamReader::read(this->_sr,(int)local_228._M_dataplus._M_p,
                                                 local_228._M_dataplus._M_p,
                                                 local_248._M_dataplus._M_p);
            if (_Var4._M_p != pcVar9) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
              poVar6 = ::std::operator<<((ostream *)local_1c8,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,"[Crate]");
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"ReadFieldSets");
              poVar6 = ::std::operator<<(poVar6,"():");
              poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x16ed);
              ::std::operator<<(poVar6," ");
              pcVar13 = "Failed to read fieldsets data at `FIELDSETS` section.";
              goto LAB_00187170;
            }
            local_1c8[0]._M_dataplus._M_p = (pointer)&local_1c8[0].field_2;
            local_1c8[0]._M_string_length = 0;
            local_1c8[0].field_2._M_local_buf[0] = '\0';
            Usd_IntegerCompression::DecompressFromBuffer
                      (local_248._M_dataplus._M_p,(size_t)local_228._M_dataplus._M_p,
                       (uint32_t *)local_268._M_dataplus._M_p,(size_t)local_288._M_dataplus._M_p,
                       local_1c8,local_208._M_dataplus._M_p);
            bVar5 = local_1c8[0]._M_string_length == 0;
            if (bVar5) {
              pIVar3 = (this->_fieldset_indices).
                       super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              for (pcVar14 = (pointer)0x0; local_288._M_dataplus._M_p != pcVar14;
                  pcVar14 = pcVar14 + 1) {
                pIVar3[(long)pcVar14].value =
                     *(uint32_t *)(local_268._M_dataplus._M_p + (long)pcVar14 * 4);
              }
              uVar7 = this->_memoryUsage;
              sVar11 = 0;
              if (uVar7 < sVar8) {
                sVar11 = sVar8;
              }
              uVar10 = uVar7 - sVar11;
              if (uVar10 < __new_size || uVar7 < sVar8) {
                sVar8 = 0;
                if (uVar10 < __new_size) {
                  sVar8 = __new_size;
                }
                this->_memoryUsage = uVar10 - sVar8;
              }
            }
            else {
              ::std::__cxx11::string::append((string *)&this->_err);
            }
            ::std::__cxx11::string::_M_dispose();
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
            poVar6 = ::std::operator<<((ostream *)local_1c8,"[error]");
            poVar6 = ::std::operator<<(poVar6,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar6 = ::std::operator<<(poVar6,"[Crate]");
            poVar6 = ::std::operator<<(poVar6,":");
            poVar6 = ::std::operator<<(poVar6,"ReadFieldSets");
            poVar6 = ::std::operator<<(poVar6,"():");
            poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x16db);
            ::std::operator<<(poVar6," ");
            pcVar13 = "Failed to read fieldsets size at `FIELDSETS` section.";
LAB_00187170:
            poVar6 = ::std::operator<<((ostream *)local_1c8,pcVar13);
            ::std::operator<<(poVar6,"\n");
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)&this->_err);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
            bVar5 = false;
          }
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    ((_Vector_base<char,_std::allocator<char>_> *)&local_208);
        }
        ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_268);
LAB_001871d5:
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  ((_Vector_base<char,_std::allocator<char>_> *)&local_248);
        return bVar5;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      poVar6 = ::std::operator<<((ostream *)local_1c8,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,"[Crate]");
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"ReadFieldSets");
      poVar6 = ::std::operator<<(poVar6,"():");
      iVar12 = 0x16c9;
    }
    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,iVar12);
    ::std::operator<<(poVar6," ");
    pcVar13 = "Reached to max memory budget.";
  }
  poVar6 = ::std::operator<<((ostream *)local_1c8,pcVar13);
  ::std::operator<<(poVar6,"\n");
LAB_00186d6a:
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::append((string *)&this->_err);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  return false;
}

Assistant:

bool CrateReader::ReadFieldSets() {
  if ((_fieldsets_index < 0) ||
      (_fieldsets_index >= int64_t(_toc.sections.size()))) {
    _err += "Invalid index for `FIELDSETS` section.\n";
    return false;
  }

  if ((_version[0] == 0) && (_version[1] < 4)) {
    _err += "Version must be 0.4.0 or later, but got " +
            std::to_string(_version[0]) + "." + std::to_string(_version[1]) +
            "." + std::to_string(_version[2]) + "\n";
    return false;
  }

  const crate::Section &s = _toc.sections[size_t(_fieldsets_index)];

  if (!_sr->seek_set(uint64_t(s.start))) {
    _err += "Failed to move to `FIELDSETS` section.\n";
    return false;
  }

  uint64_t num_fieldsets;
  if (!_sr->read8(&num_fieldsets)) {
    _err += "Failed to read # of fieldsets at `FIELDSETS` section.\n";
    return false;
  }

  if (num_fieldsets == 0) {
    // At least 1 FieldIndex(separator(~0)) must exist.
    PUSH_ERROR("`FIELDSETS` is empty.");
    return false;
  }

  if (num_fieldsets > _config.maxNumFieldSets) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Too many FieldSets {}. maxNumFieldSets is set to {}", num_fieldsets, _config.maxNumFieldSets));
  }

  CHECK_MEMORY_USAGE(size_t(num_fieldsets) * sizeof(uint32_t));

  _fieldset_indices.resize(static_cast<size_t>(num_fieldsets));

  // Create temporary space for decompressing.
  size_t compBufferSize = Usd_IntegerCompression::GetCompressedBufferSize(
      static_cast<size_t>(num_fieldsets));

  CHECK_MEMORY_USAGE(compBufferSize);

  std::vector<char> comp_buffer;
  comp_buffer.resize(compBufferSize);

  CHECK_MEMORY_USAGE(sizeof(uint32_t) * size_t(num_fieldsets));
  std::vector<uint32_t> tmp;
  tmp.resize(static_cast<size_t>(num_fieldsets));

  size_t workBufferSize = Usd_IntegerCompression::GetDecompressionWorkingSpaceSize(
          static_cast<size_t>(num_fieldsets));

  CHECK_MEMORY_USAGE(workBufferSize);
  std::vector<char> working_space;
  working_space.resize(workBufferSize);

  uint64_t fsets_size;
  if (!_sr->read8(&fsets_size)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read fieldsets size at `FIELDSETS` section.");
  }

  DCOUT("num_fieldsets = " << num_fieldsets << ", fsets_size = " << fsets_size
                           << ", comp_buffer.size = " << comp_buffer.size());

  if (fsets_size > comp_buffer.size()) {
    // Maybe corrupted?
    fsets_size = comp_buffer.size();
  }

  if (fsets_size > _sr->size()) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "FieldSets compressed data exceeds USDC data.");
  }

  if (fsets_size !=
      _sr->read(size_t(fsets_size), size_t(fsets_size),
                reinterpret_cast<uint8_t *>(comp_buffer.data()))) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read fieldsets data at `FIELDSETS` section.");
  }

  std::string err;
  Usd_IntegerCompression::DecompressFromBuffer(
      comp_buffer.data(), size_t(fsets_size), tmp.data(), size_t(num_fieldsets),
      &err, working_space.data());

  if (!err.empty()) {
    _err += err;
    return false;
  }

  for (size_t i = 0; i != num_fieldsets; ++i) {
    DCOUT("fieldset_index[" << i << "] = " << tmp[i]);
    _fieldset_indices[i].value = tmp[i];
  }

  REDUCE_MEMORY_USAGE(workBufferSize);
  REDUCE_MEMORY_USAGE(compBufferSize);

  return true;
}